

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O2

string * sago::internal::getHome_abi_cxx11_(void)

{
  __uid_t __uid;
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  runtime_error *prVar4;
  string *in_RDI;
  size_type __new_size;
  passwd *pw;
  vector<char,_std::allocator<char>_> buffer;
  passwd pwd;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  __uid = getuid();
  pcVar2 = getenv("HOME");
  if (pcVar2 == (char *)0x0 || __uid == 0) {
    pw = (passwd *)0x0;
    sVar3 = sysconf(0x46);
    __new_size = 0x4000;
    if (0 < (long)sVar3) {
      __new_size = sVar3;
    }
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<char,_std::allocator<char>_>::resize(&buffer,__new_size);
    iVar1 = getpwuid_r(__uid,(passwd *)&pwd,
                       buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,(passwd **)&pw);
    while (iVar1 == 0x22) {
      __new_size = __new_size * 2;
      std::vector<char,_std::allocator<char>_>::resize(&buffer,__new_size);
      iVar1 = getpwuid_r(__uid,(passwd *)&pwd,
                         buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,(passwd **)&pw);
    }
    if (iVar1 != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Unable to get passwd struct.");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (pw->pw_dir == (char *)0x0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"User has no home directory");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)in_RDI);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  }
  else {
    std::__cxx11::string::assign((char *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string getHome() {
	std::string res;
	int uid = getuid();
	const char* homeEnv = std::getenv("HOME");
	if ( uid != 0 && homeEnv) {
		//We only acknowlegde HOME if not root.
		res = homeEnv;
		return res;
	}
	struct passwd* pw = nullptr;
	struct passwd pwd;
	long bufsize = sysconf(_SC_GETPW_R_SIZE_MAX);
	if (bufsize < 1) {
		bufsize = 16384;
	}
	std::vector<char> buffer;
	buffer.resize(bufsize);
	int error_code = getpwuid_r(uid, &pwd, buffer.data(), buffer.size(), &pw);
	while (error_code == ERANGE) {
		// The buffer was too small. Try again with a larger buffer.
		bufsize *= 2;
		buffer.resize(bufsize);
		error_code = getpwuid_r(uid, &pwd, buffer.data(), buffer.size(), &pw);
	}
	if (error_code) {
		throw std::runtime_error("Unable to get passwd struct.");
	}
	const char* tempRes = pw->pw_dir;
	if (!tempRes) {
		throw std::runtime_error("User has no home directory");
	}
	res = tempRes;
	return res;
}